

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_writer.cpp
# Opt level: O1

void __thiscall dpfb::FontWriter::FontWriter(FontWriter *this,char *name,char *fileExtension)

{
  int iVar1;
  FontWriter *pFVar2;
  FontWriter **ppFVar3;
  FontWriter *pFVar4;
  
  this->_vptr_FontWriter = (_func_int **)&PTR__FontWriter_00127a30;
  this->name = name;
  this->fileExtension = fileExtension;
  pFVar2 = find(name);
  pFVar4 = list;
  if (pFVar2 != (FontWriter *)0x0) {
    dpfb::FontWriter((dpfb *)name);
    return;
  }
  ppFVar3 = &list;
  if (list != (FontWriter *)0x0) {
    iVar1 = strcmp(list->name,name);
    if (iVar1 < 0) {
      do {
        pFVar2 = pFVar4;
        pFVar4 = pFVar2->next;
        if (pFVar4 == (FontWriter *)0x0) break;
        iVar1 = strcmp(pFVar4->name,name);
      } while (iVar1 < 0);
      ppFVar3 = &pFVar2->next;
    }
  }
  this->next = pFVar4;
  *ppFVar3 = this;
  return;
}

Assistant:

FontWriter::FontWriter(const char* name, const char* fileExtension)
    : name {name}
    , fileExtension {fileExtension}
{
    LINK_PLUGIN(FontWriter);
}